

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_test.cpp
# Opt level: O1

bool test_type_conversion<std::shared_ptr<bool_const>const>(Boxed_Value *bv,bool expectedpass)

{
  element_type *peVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  
  bVar2 = run_test_type_conversion<std::shared_ptr<bool_const>const>(bv,expectedpass);
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error with type conversion test. From: ",0x27);
    bVar7 = ((((bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_type_info).m_flags & 1) == 0;
    pcVar6 = "";
    pcVar5 = "const ";
    if (bVar7) {
      pcVar5 = "";
    }
    lVar4 = 6;
    if (bVar7) {
      lVar4 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
    peVar1 = (bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((peVar1->m_type_info).m_flags & 0x20) == 0) {
      pcVar6 = *(char **)((peVar1->m_type_info).m_type_info + 8);
      pcVar6 = pcVar6 + (*pcVar6 == '*');
    }
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," To: ",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"const ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"St10shared_ptrIKbE",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," test was expected to ",0x16);
    pcVar6 = "fail";
    if (expectedpass) {
      pcVar6 = "succeed";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,pcVar6,(ulong)expectedpass * 3 + 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," but did not\n",0xd);
  }
  return bVar2;
}

Assistant:

bool test_type_conversion(const Boxed_Value &bv, bool expectedpass) {
  bool ret = run_test_type_conversion<To>(bv, expectedpass);

  if (!ret) {
    std::cerr << "Error with type conversion test. From: " << (bv.is_const() ? "const " : "")
              << bv.get_type_info().name() << " To: " << (std::is_const<To>::value ? "const " : "")
              << typeid(To).name() << " test was expected to " << (expectedpass ? "succeed" : "fail")
              << " but did not\n";
  }

  return ret;
}